

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O3

CTcSymLabel * __thiscall CTcParser::add_code_label(CTcParser *this,CTcToken *tok)

{
  CTcPrsSymtab *this_00;
  CTcSymLabel *pCVar1;
  
  this_00 = this->goto_symtab_;
  if (this_00 == (CTcPrsSymtab *)0x0) {
    this_00 = (CTcPrsSymtab *)CTcPrsSymtab::operator_new((CTcPrsSymtab *)0x30,(size_t)tok);
    CTcPrsSymtab::CTcPrsSymtab(this_00,(CTcPrsSymtab *)0x0);
    this->goto_symtab_ = this_00;
  }
  pCVar1 = CTcPrsSymtab::add_code_label(this_00,tok->text_,tok->text_len_,0);
  return pCVar1;
}

Assistant:

CTcSymLabel *CTcParser::add_code_label(const CTcToken *tok)
{
    /* if there's no 'goto' symbol table, create one */
    if (goto_symtab_ == 0)
        goto_symtab_ = new CTcPrsSymtab(0);

    /* create the label and return it */
    return goto_symtab_->add_code_label(tok->get_text(),
                                        tok->get_text_len(), FALSE);
}